

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detection.cpp
# Opt level: O3

int __thiscall
ncnn::Yolov3Detection::forward
          (Yolov3Detection *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  uint uVar2;
  Mat *this_00;
  void *pvVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  pointer pMVar7;
  int *piVar8;
  ulong uVar9;
  pointer pMVar10;
  long lVar11;
  int iVar12;
  float *pfVar13;
  Yolov3Detection *pYVar14;
  int iVar15;
  float *pfVar16;
  float *pfVar17;
  ulong uVar18;
  long lVar19;
  int x_offset;
  long lVar20;
  undefined4 *puVar21;
  Option *pOVar22;
  float *pfVar23;
  ulong uVar24;
  long lVar25;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar33;
  float fVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar35;
  undefined1 auVar36 [16];
  int channels;
  vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> detected_objects;
  vector<int,_std::allocator<int>_> mat_steps_channels;
  ObjectsManager objects;
  int local_1e8;
  int local_1e4;
  Yolov3Detection *local_1e0;
  int local_1d4;
  ulong local_1d0;
  pointer local_1c8;
  pointer local_1c0;
  vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> local_1b8;
  undefined4 local_1a0;
  long *local_198;
  undefined4 local_190;
  int local_18c;
  int local_188;
  undefined4 local_184;
  ulong local_180;
  int *local_178;
  iterator iStack_170;
  int *local_168;
  Option *local_158;
  long local_150;
  void *local_148;
  int *local_140;
  ulong local_138;
  undefined4 local_130;
  long *local_128;
  undefined4 local_120;
  int local_11c;
  int local_118;
  int local_114;
  ulong local_110;
  float *local_108;
  int *local_100;
  ulong local_f8;
  undefined4 local_f0;
  long *local_e8;
  undefined4 local_e0;
  int local_dc;
  int local_d8;
  undefined4 local_d4;
  ulong local_d0;
  undefined8 local_c8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_b8;
  long local_b0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_a8;
  ObjectBox local_a0;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ObjectsManager local_58;
  
  local_1e4 = ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start)->c;
  local_178 = (int *)0x0;
  iStack_170._M_current = (int *)0x0;
  local_168 = (int *)0x0;
  local_1e0 = this;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_178,(iterator)0x0,&local_1e4);
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar12 = pMVar7->h * pMVar7->w;
  pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_158 = opt;
  local_b8 = top_blobs;
  if (0x40 < (ulong)((long)pMVar10 - (long)pMVar7)) {
    uVar24 = 1;
    lVar20 = 0;
    do {
      local_1e4 = local_1e4 + *(int *)((long)&pMVar7[1].c + lVar20);
      if (iStack_170._M_current == local_168) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_178,iStack_170,&local_1e4);
        pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      else {
        *iStack_170._M_current = local_1e4;
        iStack_170._M_current = iStack_170._M_current + 1;
      }
      iVar12 = (int)((float)(*(int *)((long)&pMVar7[1].h + lVar20) *
                             *(int *)((long)&pMVar7[1].w + lVar20) + iVar12) * 0.5);
      uVar24 = uVar24 + 1;
      lVar20 = lVar20 + 0x40;
    } while (uVar24 < (ulong)((long)pMVar10 - (long)pMVar7 >> 6));
  }
  iVar6 = local_1e4 / local_1e0->box_num;
  iVar15 = -1;
  local_a8 = bottom_blobs;
  if (iVar6 != local_1e0->classes + 5) goto LAB_0016c26e;
  ObjectsManager::ObjectsManager(&local_58,(long)((local_1e0->box_num * iVar12) / 0x14));
  pYVar14 = local_1e0;
  pOVar22 = local_158;
  if (0 < local_1e0->box_num) {
    local_b0 = (long)iVar6;
    lVar20 = 0;
    do {
      piVar8 = local_178;
      lVar19 = 0;
      lVar5 = -8;
      do {
        lVar25 = lVar5;
        lVar11 = lVar19;
        iVar12 = *piVar8;
        piVar8 = piVar8 + 1;
        lVar19 = (long)iVar12;
        lVar5 = lVar25 + 0x40;
      } while ((long)iVar12 <= lVar20 * local_b0);
      pMVar7 = (local_a8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar12 = (int)(lVar20 * local_b0) - (int)lVar11;
      local_18c = *(int *)((long)&pMVar7->c + lVar25);
      local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)((long)&pMVar7->elempack + lVar25);
      local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)iVar12 * *(long *)((long)&pMVar7[1].data + lVar25) *
                     (long)local_1b8.
                           super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage +
                    *(long *)((long)&pMVar7->refcount + lVar25));
      local_188 = *(int *)((long)&pMVar7->cstep + lVar25);
      local_1a0 = *(undefined4 *)((long)&pMVar7->allocator + lVar25);
      local_198 = *(long **)((long)&pMVar7->dims + lVar25);
      local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_190 = 3;
      local_184 = 2;
      local_180 = ((long)(local_188 * local_18c) *
                   (long)local_1b8.
                         super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 0xfU &
                  0xfffffffffffffff0) /
                  (ulong)local_1b8.
                         super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
      (*pYVar14->sigmoid->_vptr_Layer[9])(pYVar14->sigmoid,&local_1b8,pOVar22);
      local_dc = *(int *)((long)&pMVar7->c + lVar25);
      local_f8 = *(ulong *)((long)&pMVar7->elempack + lVar25);
      local_108 = (float *)((long)(iVar12 + 4) * *(long *)((long)&pMVar7[1].data + lVar25) *
                            local_f8 + *(long *)((long)&pMVar7->refcount + lVar25));
      local_d8 = *(int *)((long)&pMVar7->cstep + lVar25);
      local_f0 = *(undefined4 *)((long)&pMVar7->allocator + lVar25);
      local_e8 = *(long **)((long)&pMVar7->dims + lVar25);
      local_100 = (int *)0x0;
      local_e0 = 3;
      local_d4 = 1;
      local_d0 = ((long)(local_d8 * local_dc) * local_f8 + 0xf & 0xfffffffffffffff0) / local_f8;
      local_150 = lVar20;
      (*pYVar14->sigmoid->_vptr_Layer[9])(pYVar14->sigmoid,&local_108,pOVar22);
      pfVar23 = local_108;
      local_1d0 = *(ulong *)((long)&pMVar7[1].data + lVar25);
      local_c8 = *(long *)((long)&pMVar7->refcount + lVar25);
      uVar24 = *(ulong *)((long)&pMVar7->elempack + lVar25);
      local_114 = pYVar14->classes;
      local_11c = *(int *)((long)&pMVar7->c + lVar25);
      local_118 = *(int *)((long)&pMVar7->cstep + lVar25);
      local_148 = (void *)((long)(iVar12 + 5) * local_1d0 * uVar24 + local_c8);
      local_130 = *(undefined4 *)((long)&pMVar7->allocator + lVar25);
      local_128 = *(long **)((long)&pMVar7->dims + lVar25);
      local_140 = (int *)0x0;
      local_1c0 = local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      lVar20 = (long)local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage * local_180;
      local_120 = 3;
      local_110 = ((long)(local_118 * local_11c) * uVar24 + 0xf & 0xfffffffffffffff0) / uVar24;
      local_1c8 = pMVar7;
      local_138 = uVar24;
      (*(&pYVar14->softmax)[pYVar14->softmax_enable == 0]->_vptr_Layer[9])
                ((&pYVar14->softmax)[pYVar14->softmax_enable == 0],&local_148,pOVar22);
      local_1d4 = *(int *)((long)&local_1c8->cstep + lVar25);
      if (0 < local_1d4) {
        pfVar13 = (float *)((long)&local_1c0->xmin + lVar20);
        puVar21 = (undefined4 *)((long)(iVar12 + 2) * local_1d0 * uVar24 + local_c8);
        pfVar16 = (float *)((long)(iVar12 + 3) * local_1d0 * uVar24 + local_c8);
        uVar2 = *(uint *)((long)&local_1c8->c + lVar25);
        local_1d0 = (ulong)uVar2;
        uVar24._0_4_ = local_1e0->net_width;
        uVar24._4_4_ = local_1e0->net_height;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar24;
        auVar31._0_4_ = -(uint)((undefined4)uVar24 == 0);
        auVar31._4_4_ = -(uint)((undefined4)uVar24 == 0);
        auVar31._8_4_ = -(uint)(uVar24._4_4_ == 0);
        auVar31._12_4_ = -(uint)(uVar24._4_4_ == 0);
        iVar12 = movmskpd((int)local_1e0,auVar31);
        auVar32._0_8_ =
             CONCAT44((int)((uint)(iVar12 != 0) << 0x1f) >> 0x1f,
                      (int)((uint)(iVar12 != 0) << 0x1f) >> 0x1f);
        auVar32._8_8_ = 0;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = CONCAT44(local_1d4,uVar2) & auVar32._0_8_;
        auVar36 = ~auVar32 & auVar26 | auVar36;
        auVar27._0_4_ = (float)auVar36._0_4_;
        auVar27._4_4_ = (float)auVar36._4_4_;
        auVar27._8_4_ = (float)auVar36._8_4_;
        auVar27._12_4_ = (float)auVar36._12_4_;
        auVar26 = rcpps(auVar36,auVar27);
        fVar29 = auVar26._0_4_;
        fVar30 = auVar26._4_4_;
        fVar33 = auVar26._8_4_;
        fVar34 = auVar26._12_4_;
        uVar1 = *(undefined8 *)((long)(local_1e0->biases).data + local_150 * 8);
        auVar28._0_4_ = (float)(int)uVar2;
        local_68 = (float)uVar1 * ((1.0 - auVar27._0_4_ * fVar29) * fVar29 + fVar29);
        fStack_64 = (float)((ulong)uVar1 >> 0x20) *
                    ((1.0 - auVar27._4_4_ * fVar30) * fVar30 + fVar30);
        fStack_60 = ((0.0 - auVar27._8_4_ * fVar33) * fVar33 + fVar33) * 0.0;
        fStack_5c = ((0.0 - auVar27._12_4_ * fVar34) * fVar34 + fVar34) * 0.0;
        fVar29 = (float)local_1d4;
        auVar28._4_4_ = fVar29;
        auVar28._8_8_ = 0;
        auVar26 = rcpps(ZEXT416((uint)fVar29),auVar28);
        fVar30 = auVar26._0_4_;
        fVar33 = auVar26._4_4_;
        fVar34 = auVar26._8_4_;
        fVar35 = auVar26._12_4_;
        local_88._0_4_ = (1.0 - auVar28._0_4_ * fVar30) * fVar30 + fVar30;
        local_88._4_4_ = (1.0 - fVar29 * fVar33) * fVar33 + fVar33;
        local_88._8_4_ = (0.0 - fVar34 * 0.0) * fVar34 + fVar34;
        local_88._12_4_ = (0.0 - fVar35 * 0.0) * fVar35 + fVar35;
        local_1e8 = 0;
        do {
          if (0 < (int)local_1d0) {
            local_78 = ZEXT416((uint)(float)local_1e8);
            lVar20 = 0;
            uVar24 = 0;
            do {
              local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,*puVar21);
              fVar29 = expf(*pfVar16);
              local_c8 = CONCAT44(extraout_XMM0_Db,fVar29);
              fVar29 = expf(local_1c8._0_4_);
              if ((long)local_1e0->classes < 1) {
                iVar12 = 0;
                fVar30 = 0.0;
              }
              else {
                pfVar17 = (float *)((long)local_1e8 * (long)local_11c * local_138 + lVar20 +
                                   (long)local_148);
                uVar18 = 0;
                uVar9 = 0;
                fVar33 = 0.0;
                do {
                  fVar30 = *pfVar17;
                  if (fVar33 < fVar30) {
                    uVar9 = uVar18 & 0xffffffff;
                  }
                  iVar12 = (int)uVar9;
                  if (fVar30 <= fVar33) {
                    fVar30 = fVar33;
                  }
                  uVar18 = uVar18 + 1;
                  pfVar17 = (float *)((long)pfVar17 + local_138 * local_110);
                  fVar33 = fVar30;
                } while ((long)local_1e0->classes != uVar18);
              }
              if (local_1e0->confidence_threshold <= fVar30 * *pfVar23) {
                local_a0.xmin =
                     (local_1c0->xmin + (float)(int)uVar24) * (float)local_88._0_4_ +
                     fVar29 * local_68 * -0.5;
                local_a0.ymin =
                     (*pfVar13 + (float)local_78._0_4_) * (float)local_88._4_4_ +
                     (float)local_c8 * fStack_64 * -0.5;
                local_a0.xmax = fVar29 * local_68 + local_a0.xmin;
                local_a0.ymax = (float)local_c8 * fStack_64 + local_a0.ymin;
                local_a0.prob = fVar30 * *pfVar23;
                local_a0.classid = iVar12;
                ObjectsManager::add_new_object_box(&local_58,&local_a0);
              }
              local_1c0 = (pointer)&local_1c0->ymin;
              pfVar13 = pfVar13 + 1;
              puVar21 = puVar21 + 1;
              pfVar16 = pfVar16 + 1;
              pfVar23 = pfVar23 + 1;
              uVar24 = uVar24 + 1;
              lVar20 = lVar20 + 4;
            } while (uVar24 != local_1d0);
          }
          local_1e8 = local_1e8 + 1;
        } while (local_1e8 != local_1d4);
      }
      lVar20 = local_150;
      pYVar14 = local_1e0;
      if (local_140 != (int *)0x0) {
        LOCK();
        *local_140 = *local_140 + -1;
        UNLOCK();
        if (*local_140 == 0) {
          if (local_128 == (long *)0x0) {
            if (local_148 != (void *)0x0) {
              free(local_148);
            }
          }
          else {
            (**(code **)(*local_128 + 0x18))();
          }
        }
      }
      if (local_100 != (int *)0x0) {
        LOCK();
        *local_100 = *local_100 + -1;
        UNLOCK();
        if (*local_100 == 0) {
          if (local_e8 == (long *)0x0) {
            if (local_108 != (float *)0x0) {
              free(local_108);
            }
          }
          else {
            (**(code **)(*local_e8 + 0x18))();
          }
        }
      }
      pOVar22 = local_158;
      if (local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        LOCK();
        (local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
         super__Vector_impl_data._M_finish)->xmin =
             (float)((int)(local_1b8.
                           super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->xmin + -1);
        UNLOCK();
        if ((local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl
             .super__Vector_impl_data._M_finish)->xmin == 0.0) {
          if (local_198 == (long *)0x0) {
            if (local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              free(local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                   _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            (**(code **)(*local_198 + 0x18))();
          }
        }
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < pYVar14->box_num);
  }
  local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ObjectsManager::do_objects_nms
            (&local_58,&local_1b8,pYVar14->nms_threshold,pYVar14->confidence_threshold);
  this_00 = (local_b8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,6,
              (int)((ulong)((long)local_1b8.
                                  super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1b8.
                                 super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555,4,
              pOVar22->blob_allocator);
  pvVar3 = this_00->data;
  if (pvVar3 == (void *)0x0) {
    iVar15 = -100;
LAB_0016c24f:
    if (local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_0016c254;
  }
  else {
    if ((long)this_00->c * this_00->cstep == 0) {
      iVar15 = -100;
      goto LAB_0016c24f;
    }
    if ((long)local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) {
      iVar15 = 0;
      goto LAB_0016c24f;
    }
    lVar20 = ((long)local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    iVar12 = this_00->w;
    lVar20 = lVar20 + (ulong)(lVar20 == 0);
    sVar4 = this_00->elemsize;
    piVar8 = &(local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
               _M_impl.super__Vector_impl_data._M_start)->classid;
    iVar15 = 0;
    iVar6 = 0;
    do {
      lVar19 = sVar4 * (long)iVar6;
      *(float *)((long)pvVar3 + lVar19) = (float)(*piVar8 + 1);
      *(int *)((long)pvVar3 + lVar19 + 4) = piVar8[-1];
      *(float *)((long)pvVar3 + lVar19 + 8) = ((ObjectBox *)(piVar8 + -5))->xmin;
      *(int *)((long)pvVar3 + lVar19 + 0xc) = piVar8[-4];
      *(int *)((long)pvVar3 + lVar19 + 0x10) = piVar8[-3];
      *(int *)((long)pvVar3 + lVar19 + 0x14) = piVar8[-2];
      iVar6 = iVar6 + iVar12;
      piVar8 = piVar8 + 6;
      lVar20 = lVar20 + -1;
    } while (lVar20 != 0);
LAB_0016c254:
    operator_delete(local_1b8.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b8.
                          super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.
                          super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  ObjectsManager::~ObjectsManager(&local_58);
LAB_0016c26e:
  if (local_178 != (int *)0x0) {
    operator_delete(local_178,(long)local_168 - (long)local_178);
  }
  return iVar15;
}

Assistant:

int Yolov3Detection::forward(const std::vector<Mat> &bottom_blobs, std::vector<Mat> &top_blobs, const Option &opt) const
{
    int channels = bottom_blobs[0].c;
    std::vector<int> mat_steps_channels;
    mat_steps_channels.push_back(channels);
    int prob_steps = bottom_blobs[0].w * bottom_blobs[0].h;
    for (size_t b = 1; b < bottom_blobs.size(); b++)
    {
        channels += bottom_blobs[b].c;
        mat_steps_channels.push_back(channels);
        prob_steps += bottom_blobs[b].w * bottom_blobs[b].h;
        prob_steps *= 0.5f;
    }

    const int channels_per_box = channels / box_num;

    // anchor coord + box score + num_class
    if (channels_per_box != 4 + 1 + classes)
        return -1;
        
    ObjectsManager objects(prob_steps * box_num / 20);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < box_num; pp++)
    {
        int p = pp * channels_per_box;

        int current_mat_index = 0;
        int front_mat_channels = 0;
        while (p >= mat_steps_channels[current_mat_index])
        {
            front_mat_channels = mat_steps_channels[current_mat_index];
            current_mat_index++;
        }

        const Mat &bottom_blob = bottom_blobs[current_mat_index];
        p -= front_mat_channels;

        Mat locations = bottom_blob.channel_range(p, 2);
        sigmoid->forward_inplace(locations, opt);
        Mat boxes_score = bottom_blob.channel_range(p + 4, 1);
        sigmoid->forward_inplace(boxes_score, opt);

        const float *xptr = locations.channel(0);
        const float *yptr = locations.channel(1);
        const float *wptr = bottom_blob.channel(p + 2);
        const float *hptr = bottom_blob.channel(p + 3);

        const float *box_score_ptr = boxes_score.channel(0);

        Mat scores = bottom_blob.channel_range(p + 5, classes);
        if (softmax_enable)
        {
            // softmax class scores
            softmax->forward_inplace(scores, opt);
        }
        else
        {
            // Not use softmax to avoid class competition
            sigmoid->forward_inplace(scores, opt);
        }

        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int real_w = w, real_h = h;
        if (net_height != 0 && net_width != 0)
        {
            real_w = net_width;
            real_h = net_height;
        }

        const float bias_w = biases[pp * 2] / real_w;
        const float bias_h = biases[pp * 2 + 1] / real_h;

        for (int y_offset = 0; y_offset < h; y_offset++)
        {
            for (int x_offset = 0; x_offset < w; x_offset++)
            {

                float box_w = exp(wptr[0]) * bias_w;
                float box_h = exp(hptr[0]) * bias_h;

                float xmin = (xptr[0] + x_offset) / w - box_w * 0.5f;
                float ymin = (yptr[0] + y_offset) / h - box_h * 0.5f;
                float xmax = xmin + box_w;
                float ymax = ymin + box_h;

                // box score
                float box_score = box_score_ptr[0];

                // find class index with max class score
                int class_index = 0;
                float class_score = 0.f;
                for (int q = 0; q < classes; q ++)
                {
                    float score = scores.channel(q).row(y_offset)[x_offset];

                    if (score > class_score)
                    {
                        class_index = q;
                        class_score = score;
                    }
                }

                float prob = box_score * class_score;
                if (prob >= confidence_threshold)
                {
                    ObjectBox object = {
                        .xmin = xmin,
                        .ymin = ymin,
                        .xmax = xmax,
                        .ymax = ymax,
                        .prob = prob,
                        .classid = class_index,
                    };
                    objects.add_new_object_box(object);
                }

                xptr++;
                yptr++;
                wptr++;
                hptr++;

                box_score_ptr++;
            }
        }
    }

    std::vector<ObjectBox> detected_objects;
    objects.do_objects_nms(detected_objects, nms_threshold, confidence_threshold);

    Mat &top_blob = top_blobs[0];
    top_blob.create(6, (int)detected_objects.size(), 4u, opt.blob_allocator);

    if (top_blob.empty())
        return -100;

    for (size_t i = 0; i < detected_objects.size(); i++)
    {
        const ObjectBox &r = detected_objects[i];
        float *outptr = top_blob.row(i);

        outptr[0] = r.classid + 1; // 0 reserve for background
        outptr[1] = r.prob;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}